

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

void __thiscall
MutableS2ShapeIndex::AddFaceEdge
          (MutableS2ShapeIndex *this,FaceEdge *edge,
          vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
          *all_edges)

{
  double dVar1;
  bool bVar2;
  int face_00;
  int iVar3;
  double *pdVar4;
  int local_34;
  int face;
  double kMaxUV;
  int a_face;
  vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>
  *all_edges_local;
  FaceEdge *edge_local;
  MutableS2ShapeIndex *this_local;
  
  face_00 = S2::GetFace(&(edge->edge).v0);
  iVar3 = S2::GetFace(&(edge->edge).v1);
  if (face_00 == iVar3) {
    S2::ValidFaceXYZtoUV(face_00,&(edge->edge).v0,&edge->a);
    S2::ValidFaceXYZtoUV(face_00,&(edge->edge).v1,&edge->b);
    dVar1 = 1.0 - kCellPadding;
    pdVar4 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                       ((BasicVector<Vector2,_double,_2UL> *)&edge->a,0);
    if ((((ABS(*pdVar4) <= dVar1) &&
         (pdVar4 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                             ((BasicVector<Vector2,_double,_2UL> *)&edge->a,1),
         ABS(*pdVar4) <= dVar1)) &&
        (pdVar4 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                            ((BasicVector<Vector2,_double,_2UL> *)&edge->b,0), ABS(*pdVar4) <= dVar1
        )) && (pdVar4 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                                  ((BasicVector<Vector2,_double,_2UL> *)&edge->b,1),
              ABS(*pdVar4) <= dVar1)) {
      std::vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>::
      push_back(all_edges + face_00,edge);
      return;
    }
  }
  for (local_34 = 0; local_34 < 6; local_34 = local_34 + 1) {
    bVar2 = S2::ClipToPaddedFace
                      (&(edge->edge).v0,&(edge->edge).v1,local_34,kCellPadding,&edge->a,&edge->b);
    if (bVar2) {
      std::vector<MutableS2ShapeIndex::FaceEdge,_std::allocator<MutableS2ShapeIndex::FaceEdge>_>::
      push_back(all_edges + local_34,edge);
    }
  }
  return;
}

Assistant:

inline void MutableS2ShapeIndex::AddFaceEdge(
    FaceEdge* edge, vector<FaceEdge> all_edges[6]) const {
  // Fast path: both endpoints are on the same face, and are far enough from
  // the edge of the face that don't intersect any (padded) adjacent face.
  int a_face = S2::GetFace(edge->edge.v0);
  if (a_face == S2::GetFace(edge->edge.v1)) {
    S2::ValidFaceXYZtoUV(a_face, edge->edge.v0, &edge->a);
    S2::ValidFaceXYZtoUV(a_face, edge->edge.v1, &edge->b);
    const double kMaxUV = 1 - kCellPadding;
    if (fabs(edge->a[0]) <= kMaxUV && fabs(edge->a[1]) <= kMaxUV &&
        fabs(edge->b[0]) <= kMaxUV && fabs(edge->b[1]) <= kMaxUV) {
      all_edges[a_face].push_back(*edge);
      return;
    }
  }
  // Otherwise we simply clip the edge to all six faces.
  for (int face = 0; face < 6; ++face) {
    if (S2::ClipToPaddedFace(edge->edge.v0, edge->edge.v1, face,
                             kCellPadding, &edge->a, &edge->b)) {
      all_edges[face].push_back(*edge);
    }
  }
}